

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

void __thiscall YAML::Scanner::StartStream(Scanner *this)

{
  unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_> pIndent
  ;
  _Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false> local_10;
  
  this->m_startedStream = true;
  this->m_simpleKeyAllowed = true;
  pIndent._M_t.
  super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
  ._M_t.
  super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
  .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl =
       (__uniq_ptr_data<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>,_true,_true>
        )operator_new(0x18);
  *(undefined8 *)
   pIndent._M_t.
   super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
   ._M_t.
   super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
   .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl = 0x2ffffffff;
  *(undefined4 *)
   ((long)pIndent._M_t.
          super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
          ._M_t.
          super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
          .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)pIndent._M_t.
          super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
          ._M_t.
          super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
          .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl + 0x10) = 0;
  std::
  vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
  ::
  emplace_back<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>
            ((vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
              *)&this->m_indentRefs,&pIndent);
  local_10._M_head_impl =
       (this->m_indentRefs).m_data.
       super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
       ._M_t.
       super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
       .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl;
  std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>::
  emplace_back<YAML::Scanner::IndentMarker*>
            ((deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>> *)
             &this->m_indents,&local_10._M_head_impl);
  std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>::
  ~unique_ptr(&pIndent);
  return;
}

Assistant:

void Scanner::StartStream() {
  m_startedStream = true;
  m_simpleKeyAllowed = true;
  std::unique_ptr<IndentMarker> pIndent(
      new IndentMarker(-1, IndentMarker::NONE));
  m_indentRefs.push_back(std::move(pIndent));
  m_indents.push(&m_indentRefs.back());
}